

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

char * __thiscall SQLite::Statement::getColumnDeclaredType(Statement *this,int aIndex)

{
  sqlite3_stmt *pStmt;
  char *pcVar1;
  Exception *this_00;
  
  checkIndex(this,aIndex);
  pStmt = getPreparedStatement(this);
  pcVar1 = sqlite3_column_decltype(pStmt,aIndex);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,"Could not determine declared column type.");
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const char* Statement::getColumnDeclaredType(const int aIndex) const
{
    checkIndex(aIndex);
    const char * result = sqlite3_column_decltype(getPreparedStatement(), aIndex);
    if (!result)
    {
        throw SQLite::Exception("Could not determine declared column type.");
    }
    else
    {
        return result;
    }
}